

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<wchar_t_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,wchar_t **needle,wchar_t **haystack)

{
  wchar_t *__haystack;
  wchar_t *pwVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  bool bVar3;
  AssertionResult AVar4;
  AssertionResult local_60;
  char *local_50;
  char *local_48;
  char *needle_expr_local;
  char *haystack_expr_local;
  char *begin_string_quote;
  
  pwVar1 = *needle;
  __haystack = *haystack;
  local_48 = needle_expr;
  needle_expr_local = haystack_expr;
  if (pwVar1 == (wchar_t *)0x0 || __haystack == (wchar_t *)0x0) {
    bVar3 = pwVar1 == __haystack;
  }
  else {
    pwVar1 = wcsstr(__haystack,pwVar1);
    bVar3 = pwVar1 != (wchar_t *)0x0;
    needle_expr = (char *)extraout_RDX;
  }
  if (bVar3 == expected_to_be_substring) {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    haystack_expr_local = "L\"";
    local_60.success_ = false;
    local_60.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar2 = AssertionResult::operator<<(&local_60,(char (*) [11])"Value of: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0xa6d9f5);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0xa6d2fb);
    pAVar2 = AssertionResult::operator<<(pAVar2,&haystack_expr_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,needle);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0xa6daa9);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0xa6d307);
    local_50 = "not ";
    if (expected_to_be_substring) {
      local_50 = "";
    }
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"a substring of ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&needle_expr_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0xa6d9f5);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0xa6d2b6);
    pAVar2 = AssertionResult::operator<<(pAVar2,&haystack_expr_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,haystack);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0xa6d3ab);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    needle_expr = (char *)extraout_RDX_00;
  }
  AVar4.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)needle_expr;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}